

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# send2LMAT.c
# Opt level: O1

void send2LMAT(char *name,char *version,char *runid,char *message,int msgid,char *location,
              char *debug_dir)

{
  __pid_t _Var1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  
  if (name == (char *)0x0) {
    name = "NULL";
  }
  uVar2 = g_strdup(name);
  if (version == (char *)0x0) {
    version = "NULL";
  }
  uVar3 = g_strdup(version);
  if (message == (char *)0x0) {
    message = "NULL";
  }
  uVar4 = g_strdup(message);
  if (location == (char *)0x0) {
    location = "NULL";
  }
  uVar5 = g_strdup(location);
  uVar6 = g_strdup("NULL");
  if (runid == (char *)0x0) {
    runid = "NULL";
  }
  uVar7 = g_strdup(runid);
  uVar8 = g_strdup_printf("%d",msgid);
  _Var1 = getpid();
  uVar9 = g_strdup_printf("%ld",(long)_Var1);
  uVar10 = g_get_host_name();
  uVar10 = g_strdup(uVar10);
  fprintf(_stderr,"%s [PID %s RUNID %s] on %s:\n\t%s: %s\n[%s - %s]\n",uVar2,uVar9,uVar7,uVar10,
          uVar8,uVar4,uVar5,uVar3);
  g_free(uVar10);
  g_free(uVar9);
  g_free(uVar8);
  g_free(uVar7);
  g_free(uVar6);
  g_free(uVar5);
  g_free(uVar4);
  g_free(uVar3);
  g_free(uVar2);
  return;
}

Assistant:

void send2LMAT(const char *name, const char *version, const char *runid,
               const char *message, int msgid, const char *location, const char *debug_dir) {
/*
    g_spawn_*'s argv arguments are of gchar ** type indicating that they may be
    modified by the called function
*/
    gchar *nam = name ? g_strdup(name) : g_strdup("NULL");
    gchar *ver = version ? g_strdup(version) : g_strdup("NULL");
    gchar *msg = message ? g_strdup(message) : g_strdup("NULL");
    gchar *loc = location ? g_strdup(location) : g_strdup("NULL");
    gchar *dbg G_GNUC_UNUSED = _s2dir && debug_dir ? g_strdup(debug_dir) : g_strdup("NULL");

    gchar *rid = runid ? g_strdup(runid) : g_strdup("NULL");
    gchar *mid = g_strdup_printf("%d", msgid);
    gchar *pid = g_strdup_printf("%ld", (long) getpid());

    gchar *host = g_strdup(g_get_host_name());

#ifndef STANDALONE
    if (!_s2err && p2sc_send2LMAT(nam, ver, rid, msg, mid, loc, dbg, pid, host)) ;
    else
#endif
        fprintf(stderr, "%s [PID %s RUNID %s] on %s:\n\t%s: %s\n[%s - %s]\n",
                nam, pid, rid, host, mid, msg, loc, ver);

    g_free(host);

    g_free(pid);
    g_free(mid);
    g_free(rid);

    g_free(dbg);
    g_free(loc);
    g_free(msg);
    g_free(ver);
    g_free(nam);
}